

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionBaseName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  Kind KVar1;
  void *pvVar2;
  Node *RootNode;
  long lVar3;
  char *pcVar4;
  undefined8 *puVar5;
  
  pvVar2 = this->RootNode;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x145a,"bool llvm::ItaniumPartialDemangler::isFunction() const");
  }
  if (*(char *)((long)pvVar2 + 8) != '\x12') {
    return (char *)0x0;
  }
  puVar5 = (undefined8 *)((long)pvVar2 + 0x18);
  do {
    RootNode = (Node *)*puVar5;
    KVar1 = RootNode->K;
    lVar3 = 0x10;
    if (KVar1 < KLocalName) {
      if (KVar1 != KAbiTagAttr) {
        if (KVar1 == KNestedName) goto LAB_00188593;
LAB_001885a1:
        pcVar4 = printNode(RootNode,Buf,N);
        return pcVar4;
      }
    }
    else if (KVar1 == KLocalName) {
LAB_00188593:
      lVar3 = 0x18;
    }
    else if ((KVar1 != KStdQualifiedName) && (KVar1 != KNameWithTemplateArgs)) goto LAB_001885a1;
    puVar5 = (undefined8 *)((long)&RootNode->_vptr_Node + lVar3);
  } while( true );
}

Assistant:

char *ItaniumPartialDemangler::getFunctionBaseName(char *Buf, size_t *N) const {
  if (!isFunction())
    return nullptr;

  Node *Name = static_cast<FunctionEncoding *>(RootNode)->getName();

  while (true) {
    switch (Name->getKind()) {
    case Node::KAbiTagAttr:
      Name = static_cast<AbiTagAttr *>(Name)->Base;
      continue;
    case Node::KStdQualifiedName:
      Name = static_cast<StdQualifiedName *>(Name)->Child;
      continue;
    case Node::KNestedName:
      Name = static_cast<NestedName *>(Name)->Name;
      continue;
    case Node::KLocalName:
      Name = static_cast<LocalName *>(Name)->Entity;
      continue;
    case Node::KNameWithTemplateArgs:
      Name = static_cast<NameWithTemplateArgs *>(Name)->Name;
      continue;
    default:
      return printNode(Name, Buf, N);
    }
  }
}